

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifc_struct_defs.c
# Opt level: O0

uint16_t ll_net_info_serialize(llabs_network_info_t *net_info,uint8_t *buff)

{
  uint8_t *local_20;
  uint8_t *buff_cpy;
  uint8_t *buff_local;
  llabs_network_info_t *net_info_local;
  
  local_20 = buff;
  buff_cpy = buff;
  buff_local = (uint8_t *)net_info;
  write_uint32(net_info->network_id_node,&local_20);
  write_uint32(*(uint32_t *)(buff_local + 4),&local_20);
  write_uint8(buff_local[8],&local_20);
  write_uint32(*(uint32_t *)(buff_local + 9),&local_20);
  write_uint32(*(uint32_t *)(buff_local + 0xd),&local_20);
  write_uint16(*(uint16_t *)(buff_local + 0x11),&local_20);
  write_uint8(buff_local[0x13],&local_20);
  write_uint8((uint8_t)*(undefined4 *)(buff_local + 0x14),&local_20);
  write_uint8(buff_local[0x18],&local_20);
  write_uint64(*(uint64_t *)(buff_local + 0x19),&local_20);
  write_uint8(buff_local[0x21],&local_20);
  return (short)local_20 - (short)buff_cpy;
}

Assistant:

uint16_t ll_net_info_serialize(const llabs_network_info_t *net_info, uint8_t buff[NET_INFO_BUFF_SIZE])
{
    uint8_t * buff_cpy = buff;
    write_uint32(net_info->network_id_node, &buff_cpy);
    write_uint32(net_info->network_id_gw, &buff_cpy);
    write_uint8(net_info->gateway_channel, &buff_cpy);
    write_uint32(net_info->gateway_frequency, &buff_cpy);
    write_uint32(net_info->last_rx_tick, &buff_cpy);
    write_uint16(net_info->rssi, &buff_cpy);
    write_uint8(net_info->snr, &buff_cpy);
    write_uint8(net_info->connection_status, &buff_cpy);
    write_uint8(net_info->is_scanning_gateways, &buff_cpy);
    write_uint64(net_info->gateway_id, &buff_cpy);
    write_uint8(net_info->is_repeater, &buff_cpy);
    return buff_cpy - buff;
}